

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

double __thiscall despot::QNode::Weight(QNode *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Self __tmp;
  double dVar3;
  double local_18;
  
  p_Var1 = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->children_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 == p_Var2) {
    local_18 = 0.0;
  }
  else {
    local_18 = 0.0;
    do {
      dVar3 = State::Weight((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                            p_Var1[1]._M_parent);
      local_18 = local_18 + dVar3;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return local_18;
}

Assistant:

double QNode::Weight() const {
	double weight = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		weight += it->second->Weight();
	}
	return weight;
}